

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  char cVar1;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_iovec_t message_02;
  ptls_iovec_t message_03;
  ptls_iovec_t message_04;
  ptls_iovec_t message_05;
  ptls_iovec_t message_06;
  ptls_t *tls_00;
  char *in_RDX;
  uint8_t *in_RSI;
  size_t in_RDI;
  int in_R8D;
  ptls_handshake_properties_t *in_R9;
  int ret;
  uint8_t type;
  size_t in_stack_00000048;
  ptls_t *in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  ptls_message_emitter_t *in_stack_00000098;
  ptls_t *in_stack_000000a0;
  ptls_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  size_t in_stack_000000b8;
  ptls_handshake_properties_t *in_stack_000000c8;
  ptls_t *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined3 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  cVar1 = *in_RDX;
  tls_00 = (ptls_t *)(ulong)(*(int *)(in_RDI + 8) - 1);
  switch(tls_00) {
  case (ptls_t *)0x0:
  case (ptls_t *)0x1:
    if ((cVar1 == '\x02') && (in_R8D != 0)) {
      message_00.len = in_stack_00000048;
      message_00.base = (uint8_t *)message.len;
      iVar2 = client_handle_hello((ptls_t *)message.base,(ptls_message_emitter_t *)tls,message_00,
                                  (ptls_handshake_properties_t *)emitter);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x2:
    if (cVar1 == '\b') {
      iVar2 = client_handle_encrypted_extensions
                        (in_stack_000000d0,(ptls_iovec_t)in_stack_000000d8,in_stack_000000c8);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x3:
    if (cVar1 == '\r') {
      message_05.len = in_RDI;
      message_05.base = in_RSI;
      iVar2 = client_handle_certificate_request
                        ((ptls_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),message_05,in_R9);
      return iVar2;
    }
  case (ptls_t *)0x4:
    if (cVar1 == '\v') {
      message_03.len._0_4_ = in_stack_ffffffffffffffc8;
      message_03.base = (uint8_t *)tls_00;
      message_03.len._4_4_ = CONCAT13(cVar1,in_stack_ffffffffffffffcc);
      iVar2 = client_handle_certificate
                        ((ptls_t *)(ulong)CONCAT14(0xb,in_stack_ffffffffffffffb8),message_03);
    }
    else if (cVar1 == '\x19') {
      iVar2 = client_handle_compressed_certificate
                        (in_stack_00000050,(ptls_iovec_t)in_stack_00000058);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x5:
    if (cVar1 == '\x0f') {
      message_04.base._4_4_ = CONCAT13(cVar1,in_stack_ffffffffffffffcc);
      message_04.base._0_4_ = in_stack_ffffffffffffffc8;
      message_04.len = (size_t)in_R9;
      iVar2 = client_handle_certificate_verify(tls_00,message_04);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x6:
    if ((cVar1 == '\x14') && (in_R8D != 0)) {
      message_01.len = (size_t)in_stack_000000b0;
      message_01.base = (uint8_t *)in_stack_000000a8;
      iVar2 = client_handle_finished(in_stack_000000a0,in_stack_00000098,message_01);
    }
    else {
      iVar2 = 10;
    }
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x11da,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  case (ptls_t *)0xd:
    if (cVar1 == '\x04') {
      message_02.len = in_stack_000000b8;
      message_02.base = in_stack_000000b0;
      iVar2 = client_handle_new_session_ticket(in_stack_000000a8,message_02);
    }
    else if (cVar1 == '\x18') {
      message_06.len = in_RDI;
      message_06.base = in_RSI;
      iVar2 = handle_key_update((ptls_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                                (ptls_message_emitter_t *)in_R9,message_06);
    }
    else {
      iVar2 = 10;
    }
  }
  return iVar2;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}